

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

size_t __thiscall
cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll
          (cmGlobalUnixMakefileGenerator3 *this,cmLocalGenerator *lg)

{
  bool bVar1;
  reference ppcVar2;
  size_t sVar3;
  _Self local_90;
  _Self local_88;
  const_iterator t;
  cmStateSnapshot local_70;
  mapped_type *local_58;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *targets;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  size_t count;
  cmLocalGenerator *lg_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&targets);
  cmLocalGenerator::GetStateSnapshot(&local_70,lg);
  local_58 = std::
             map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             ::operator[](&this->DirectoryTargetsMap,&local_70);
  local_88._M_node =
       (_Base_ptr)
       std::
       set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
       ::begin(local_58);
  while( true ) {
    local_90._M_node =
         (_Base_ptr)
         std::
         set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         ::end(local_58);
    bVar1 = std::operator!=(&local_88,&local_90);
    sVar3 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (!bVar1) break;
    ppcVar2 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_88);
    sVar3 = CountProgressMarksInTarget
                      (this,*ppcVar2,
                       (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                        *)&targets);
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count =
         sVar3 + emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&local_88);
  }
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&targets);
  return sVar3;
}

Assistant:

size_t cmGlobalUnixMakefileGenerator3::CountProgressMarksInAll(
  cmLocalGenerator* lg)
{
  size_t count = 0;
  std::set<cmGeneratorTarget const*> emitted;
  std::set<cmGeneratorTarget const*> const& targets =
    this->DirectoryTargetsMap[lg->GetStateSnapshot()];
  for (std::set<cmGeneratorTarget const*>::const_iterator t = targets.begin();
       t != targets.end(); ++t) {
    count += this->CountProgressMarksInTarget(*t, emitted);
  }
  return count;
}